

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-sampling.cpp
# Opt level: O2

llama_sampler *
llama_sampler_init_dry_testing
          (int32_t context_size,float dry_multiplier,float dry_base,int32_t dry_allowed_length,
          int32_t dry_penalty_last_n,
          vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
          *seq_breakers)

{
  _Hashtable<int,_std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_false>_>
  *this;
  llama_sampler_context_t pvVar1;
  undefined8 *puVar2;
  int *piVar3;
  llama_sampler *plVar4;
  char *format;
  undefined8 *puVar5;
  allocator_type local_69;
  llama_sampler_context_t local_68;
  llama_sampler *local_60;
  llama_token head_token;
  llama_vocab dummy_vocab;
  vector<int,_std::allocator<int>_> tail_tokens;
  
  local_60 = (llama_sampler *)CONCAT44(local_60._4_4_,dry_base);
  local_68 = (llama_sampler_context_t)CONCAT44(local_68._4_4_,dry_multiplier);
  llama_vocab::llama_vocab(&dummy_vocab);
  plVar4 = llama_sampler_init_dry
                     (&dummy_vocab,context_size,local_68._0_4_,local_60._0_4_,dry_allowed_length,
                      dry_penalty_last_n,(char **)0x0,0);
  pvVar1 = plVar4->ctx;
  this = (_Hashtable<int,_std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_false>_>
          *)((long)pvVar1 + 0x18);
  std::
  _Hashtable<int,_std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_false>_>
  ::clear(this);
  puVar5 = *(undefined8 **)seq_breakers;
  puVar2 = *(undefined8 **)(seq_breakers + 8);
  if (puVar5 == puVar2) {
    format = "empty DRY sequence breakers list in llama_sampler_init_dry_testing\n";
  }
  else {
    local_68 = pvVar1;
    local_60 = plVar4;
    for (; puVar5 != puVar2; puVar5 = puVar5 + 3) {
      piVar3 = (int *)*puVar5;
      if (piVar3 == (int *)puVar5[1]) {
        llama_log_internal(GGML_LOG_LEVEL_WARN,"skipping DRY empty sequence breaker\n");
      }
      else {
        head_token = *piVar3;
        std::vector<int,std::allocator<int>>::
        vector<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>,void>
                  ((vector<int,std::allocator<int>> *)&tail_tokens,
                   (__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>)
                   (piVar3 + 1),(int *)puVar5[1],&local_69);
        std::
        _Hashtable<int,std::pair<int_const,std::vector<int,std::allocator<int>>>,std::allocator<std::pair<int_const,std::vector<int,std::allocator<int>>>>,std::__detail::_Select1st,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,false>>
        ::_M_emplace<int&,std::vector<int,std::allocator<int>>>
                  ((_Hashtable<int,std::pair<int_const,std::vector<int,std::allocator<int>>>,std::allocator<std::pair<int_const,std::vector<int,std::allocator<int>>>>,std::__detail::_Select1st,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,false>>
                    *)this,&head_token,(vector<int,std::allocator<int>> *)&tail_tokens);
        std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                  ((_Vector_base<int,_std::allocator<int>_> *)&tail_tokens);
      }
    }
    plVar4 = local_60;
    if (*(long *)((long)local_68 + 0x30) != 0) goto LAB_002467e9;
    format = "no valid DRY sequence breakers processed in llama_sampler_init_dry_testing\n";
  }
  llama_log_internal(GGML_LOG_LEVEL_WARN,format);
LAB_002467e9:
  llama_vocab::~llama_vocab(&dummy_vocab);
  return plVar4;
}

Assistant:

struct llama_sampler * llama_sampler_init_dry_testing(int32_t context_size, float dry_multiplier, float dry_base, int32_t dry_allowed_length, int32_t dry_penalty_last_n, const std::vector<std::vector<llama_token>>& seq_breakers) {
    llama_vocab dummy_vocab;
    auto * result = llama_sampler_init_dry(&dummy_vocab, context_size, dry_multiplier, dry_base, dry_allowed_length, dry_penalty_last_n, NULL, 0);
    auto * ctx = (llama_sampler_dry *) result->ctx;

    // Process the token-based sequence breakers
    ctx->dry_processed_breakers.clear();
    if (seq_breakers.empty()) {
        LLAMA_LOG_WARN("empty DRY sequence breakers list in llama_sampler_init_dry_testing\n");
    } else {
        for (const auto& breaker : seq_breakers) {
            if (breaker.empty()) {
                LLAMA_LOG_WARN("skipping DRY empty sequence breaker\n");
                continue;
            }
            llama_token head_token = breaker[0];
            std::vector<llama_token> tail_tokens(breaker.begin() + 1, breaker.end());
            ctx->dry_processed_breakers.emplace(head_token, std::move(tail_tokens));
        }

        if (ctx->dry_processed_breakers.empty()) {
            LLAMA_LOG_WARN("no valid DRY sequence breakers processed in llama_sampler_init_dry_testing\n");
        }
    }

    return result;
}